

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

bool __thiscall
wasm::analysis::Vector<wasm::analysis::Bool>::join
          (Vector<wasm::analysis::Bool> *this,Element *joinee,SingletonElement *joiner)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  unsigned_long *index;
  SingletonElement *joiner_local;
  Element *joinee_local;
  Vector<wasm::analysis::Bool> *this_local;
  
  uVar1 = (joiner->super_pair<unsigned_long,_bool>).first;
  sVar3 = std::vector<bool,_std::allocator<bool>_>::size(joinee);
  if (uVar1 < sVar3) {
    bVar2 = joinAtIndex(this,joinee,(joiner->super_pair<unsigned_long,_bool>).first,
                        &(joiner->super_pair<unsigned_long,_bool>).second);
    return bVar2;
  }
  __assert_fail("index < joinee.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/analysis/lattices/vector.h"
                ,0x5f,
                "bool wasm::analysis::Vector<wasm::analysis::Bool>::join(Element &, const SingletonElement &) const [L = wasm::analysis::Bool]"
               );
}

Assistant:

bool join(Element& joinee, const SingletonElement& joiner) const noexcept {
    const auto& [index, elem] = joiner;
    assert(index < joinee.size());
    return joinAtIndex(joinee, index, elem);
  }